

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_FMGenerate(ym3438_t *chip)

{
  ushort uVar1;
  uint uVar2;
  ushort local_1c;
  ushort local_1a;
  ushort local_18;
  Bit16s output;
  Bit16u level;
  Bit16u quarter;
  Bit16u phase;
  Bit32u slot;
  ym3438_t *chip_local;
  
  uVar2 = (chip->cycles + 0x13) % 0x18;
  uVar1 = chip->fm_mod[uVar2] + (short)(chip->pg_phase[uVar2] >> 10);
  local_18 = uVar1;
  if ((uVar1 & 0x100) != 0) {
    local_18 = uVar1 & 0x3ff ^ 0xff;
  }
  local_18 = local_18 & 0xff;
  local_1a = logsinrom[local_18] + chip->eg_out[uVar2] * 4;
  if (0x1fff < local_1a) {
    local_1a = 0x1fff;
  }
  local_1c = (ushort)((int)((exprom[(int)(local_1a & 0xff ^ 0xff)] | 0x400) << 2) >>
                     ((byte)(local_1a >> 8) & 0x1f));
  if ((uVar1 & 0x200) == 0) {
    local_1c = local_1c ^ (ushort)chip->mode_test_21[4] << 0xd;
  }
  else {
    local_1c = (local_1c ^ 0xffff ^ (ushort)chip->mode_test_21[4] << 0xd) + 1;
  }
  chip->fm_out[uVar2] = (short)(local_1c << 2) >> 2;
  return;
}

Assistant:

void OPN2_FMGenerate(ym3438_t *chip)
{
    Bit32u slot = (chip->cycles + 19) % 24;
    /* Calculate phase */
    Bit16u phase = (chip->fm_mod[slot] + (chip->pg_phase[slot] >> 10)) & 0x3ff;
    Bit16u quarter;
    Bit16u level;
    Bit16s output;
    if (phase & 0x100)
    {
        quarter = (phase ^ 0xff) & 0xff;
    }
    else
    {
        quarter = phase & 0xff;
    }
    level = logsinrom[quarter];
    /* Apply envelope */
    level += chip->eg_out[slot] << 2;
    /* Transform */
    if (level > 0x1fff)
    {
        level = 0x1fff;
    }
    output = ((exprom[(level & 0xff) ^ 0xff] | 0x400) << 2) >> (level >> 8);
    if (phase & 0x200)
    {
        output = ((~output) ^ (chip->mode_test_21[4] << 13)) + 1;
    }
    else
    {
        output = output ^ (chip->mode_test_21[4] << 13);
    }
    output <<= 2;
    output >>= 2;
    chip->fm_out[slot] = output;
}